

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O3

JL_STATUS MarshallObject(void *Input,JlMarshallElement *Description,JlDataObject **pNewObject)

{
  JL_NUM_TYPE JVar1;
  JL_STATUS JVar2;
  size_t sVar3;
  uint8_t *InputU8;
  uint64_t NumberU64;
  int64_t NumberS64;
  bool bVar4;
  double NumberF64;
  
  *pNewObject = (JlDataObject *)0x0;
  JVar2 = JL_STATUS_INVALID_TYPE;
  switch(Description->Type) {
  case JL_DATA_TYPE_STRING:
    if (Description->FieldSize == 0) {
      Input = *Input;
LAB_001053a9:
      JVar2 = JlCreateObject(JL_DATA_TYPE_STRING,pNewObject);
      if ((char *)Input != (char *)0x0 && JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JlSetObjectString(*pNewObject,(char *)Input);
        return JVar2;
      }
    }
    else {
      sVar3 = 0;
      do {
        if (*(char *)((long)Input + sVar3) == '\0') goto LAB_001053a9;
        sVar3 = sVar3 + 1;
      } while (Description->FieldSize != sVar3);
      JVar2 = JL_STATUS_STRING_NOT_TERMINATED;
    }
    break;
  case JL_DATA_TYPE_NUMBER:
    JVar1 = Description->NumberType;
    if (JVar1 == JL_NUM_TYPE_FLOAT) {
      if (Description->FieldSize == 4) {
        NumberF64 = (double)*Input;
      }
      else {
        if (Description->FieldSize != 8) {
          return JL_STATUS_INVALID_SPECIFICATION;
        }
        NumberF64 = *Input;
      }
      JVar2 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JlSetObjectNumberF64(*pNewObject,NumberF64);
        return JVar2;
      }
    }
    else if (JVar1 == JL_NUM_TYPE_SIGNED) {
      JVar2 = JL_STATUS_INVALID_SPECIFICATION;
      switch(Description->FieldSize) {
      case 1:
        NumberS64 = (int64_t)*Input;
        break;
      case 2:
        NumberS64 = (int64_t)*Input;
        break;
      default:
        goto switchD_001052c9_caseD_4;
      case 4:
        NumberS64 = (int64_t)*Input;
        break;
      case 8:
        NumberS64 = *Input;
      }
      JVar2 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JlSetObjectNumberS64(*pNewObject,NumberS64);
        return JVar2;
      }
    }
    else if (JVar1 == JL_NUM_TYPE_UNSIGNED) {
      JVar2 = JL_STATUS_INVALID_SPECIFICATION;
      switch(Description->FieldSize) {
      case 1:
        NumberU64 = (uint64_t)*Input;
        break;
      case 2:
        NumberU64 = (uint64_t)*Input;
        break;
      default:
        goto switchD_001052c9_caseD_4;
      case 4:
        NumberU64 = (uint64_t)*Input;
        break;
      case 8:
        NumberU64 = *Input;
      }
      JVar2 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar2 == JL_STATUS_SUCCESS) {
        if (Description->IsHex != true) {
          JVar2 = JlSetObjectNumberU64(*pNewObject,NumberU64);
          return JVar2;
        }
        JVar2 = JlSetObjectNumberHex(*pNewObject,NumberU64);
        return JVar2;
      }
    }
    break;
  case JL_DATA_TYPE_BOOL:
    JVar2 = JL_STATUS_INVALID_SPECIFICATION;
    switch(Description->FieldSize) {
    case 1:
      bVar4 = *Input == '\0';
      break;
    case 2:
      bVar4 = *Input == 0;
      break;
    default:
      goto switchD_001052c9_caseD_4;
    case 4:
      bVar4 = *Input == 0;
      break;
    case 8:
      bVar4 = *Input == 0;
    }
    JVar2 = JlCreateObject(JL_DATA_TYPE_BOOL,pNewObject);
    if (JVar2 == JL_STATUS_SUCCESS) {
      JVar2 = JlSetObjectBool(*pNewObject,!bVar4);
      return JVar2;
    }
    break;
  case JL_DATA_TYPE_DICTIONARY:
    JVar2 = JlCreateObject(JL_DATA_TYPE_DICTIONARY,pNewObject);
    if (JVar2 == JL_STATUS_SUCCESS) {
      JVar2 = MarshallDictionary(Input,Description->ChildStructDescription,
                                 (ulong)Description->ChildStructDescriptionCount,*pNewObject);
      return JVar2;
    }
  }
switchD_001052c9_caseD_4:
  return JVar2;
}

Assistant:

static
JL_STATUS
    MarshallObject
    (
        void const*                 Input,
        JlMarshallElement const*    Description,
        JlDataObject**              pNewObject
    )
{
    JL_STATUS jlStatus;

    *pNewObject = NULL;

    if( JL_DATA_TYPE_STRING == Description->Type )
    {
        // Regular allocated string.
        // Input is a pointer to a string.
        jlStatus = MarshallString( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type )
    {
        jlStatus = MarshallNumber( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = MarshallBool( Input, Description, pNewObject );
    }
    else if (JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        // This is only called when we are processing dictionary in a list, otherwise dictionaries within
        // dictionaries are processed directly in MarshallDictionary.
        // Dictionaries within a list are always created new, they do not preserve an existing dictionary in
        // the list.
        jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, pNewObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = MarshallDictionary( Input, Description->ChildStructDescription, Description->ChildStructDescriptionCount, *pNewObject );
        }
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    return jlStatus;
}